

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_options.c
# Opt level: O0

int archive_set_option(archive *a,char *m,char *o,char *v)

{
  int iVar1;
  option_handler in_RCX;
  option_handler in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *unaff_retaddr;
  
  iVar1 = _archive_set_either_option((archive *)v,unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX);
  return iVar1;
}

Assistant:

int
_archive_set_option(struct archive *a,
    const char *m, const char *o, const char *v,
    int magic, const char *fn, option_handler use_option)
{
	const char *mp, *op, *vp;
	int r;

	archive_check_magic(a, magic, ARCHIVE_STATE_NEW, fn);

	mp = m != NULL && m[0] == '\0' ? NULL : m;
	op = o != NULL && o[0] == '\0' ? NULL : o;
	vp = v != NULL && v[0] == '\0' ? NULL : v;

	if (op == NULL && vp == NULL)
		return (ARCHIVE_OK);
	if (op == NULL) {
		archive_set_error(a, ARCHIVE_ERRNO_MISC, "Empty option");
		return (ARCHIVE_FAILED);
	}

	r = use_option(a, mp, op, vp);
	if (r == ARCHIVE_WARN - 1) {
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Unknown module name: `%s'", mp);
		return (ARCHIVE_FAILED);
	}
	if (r == ARCHIVE_WARN) {
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Undefined option: `%s%s%s%s%s%s'",
		    vp?"":"!", mp?mp:"", mp?":":"", op, vp?"=":"", vp?vp:"");
		return (ARCHIVE_FAILED);
	}
	return (r);
}